

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveBase.h
# Opt level: O0

void anurbs::CurveBase<3L>::register_python(module *m)

{
  char *name_00;
  class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>> *pcVar1;
  arg aVar2;
  undefined1 local_100;
  arg local_f8;
  offset_in_Model_to_subr local_e8 [2];
  arg local_d8;
  arg local_c8;
  arg local_b8;
  arg local_a8;
  offset_in_Model_to_subr local_98 [6];
  anon_class_1_0_00000001 local_61;
  offset_in_Model_to_subr local_60 [4];
  handle local_40;
  class_<anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveBase<3L>_>_> local_38;
  string local_30 [8];
  string name;
  module *m_local;
  
  name.field_2._8_8_ = m;
  CurveBase<3l>::python_name_abi_cxx11_();
  local_40.m_ptr = *(PyObject **)name.field_2._8_8_;
  name_00 = (char *)std::__cxx11::string::c_str();
  pybind11::class_<anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveBase<3L>_>_>::class_<>
            (&local_38,local_40,name_00);
  local_60[1] = 0;
  local_60[0] = 0x11;
  pcVar1 = (class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>> *)
           pybind11::class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>>::
           def_property_readonly<long(anurbs::CurveBase<3l>::*)()const>
                     ((class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>> *)
                      &local_38,"degree",local_60);
  pcVar1 = (class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>> *)
           pybind11::class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>>::
           def_property_readonly<anurbs::CurveBase<3l>::register_python(pybind11::module&)::_lambda(anurbs::CurveBase<3l>&)_1_>
                     (pcVar1,"dimension",&local_61);
  local_98[5] = 0;
  local_98[4] = 0x19;
  pcVar1 = (class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>> *)
           pybind11::class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>>::
           def_property_readonly<anurbs::Interval(anurbs::CurveBase<3l>::*)()const>
                     (pcVar1,"domain",local_98 + 4);
  local_98[3] = 0;
  local_98[2] = 0x21;
  pcVar1 = (class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>> *)
           pybind11::class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>>::
           def_property_readonly<std::vector<anurbs::Interval,std::allocator<anurbs::Interval>>(anurbs::CurveBase<3l>::*)()const>
                     (pcVar1,"spans",local_98 + 2);
  local_98[1] = 0;
  local_98[0] = 0x31;
  local_b8 = pybind11::literals::operator____a("t",1);
  local_a8.name = local_b8.name;
  local_a8._8_1_ = local_b8._8_1_;
  local_d8 = pybind11::literals::operator____a("order",5);
  local_c8.name = local_d8.name;
  local_c8._8_1_ = local_d8._8_1_;
  pcVar1 = (class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>> *)
           pybind11::class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>>::
           def<std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>(anurbs::CurveBase<3l>::*)(double,long)const,pybind11::arg,pybind11::arg>
                     (pcVar1,"derivatives_at",local_98,&local_a8,&local_c8);
  local_e8[1] = 0;
  local_e8[0] = 0x29;
  aVar2 = pybind11::literals::operator____a("t",1);
  local_f8.name = aVar2.name;
  local_100 = aVar2._8_1_;
  local_f8._8_1_ = local_100;
  pybind11::class_<anurbs::CurveBase<3l>,std::shared_ptr<anurbs::CurveBase<3l>>>::
  def<Eigen::Matrix<double,1,3,1,1,3>(anurbs::CurveBase<3l>::*)(double)const,pybind11::arg>
            (pcVar1,"point_at",local_e8,&local_f8);
  pybind11::class_<anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveBase<3L>_>_>::~class_
            (&local_38);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = CurveBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // read-only properties
            .def_property_readonly("degree", &Type::degree)
            .def_property_readonly("dimension", [](Type&) {
                return Type::dimension(); })
            .def_property_readonly("domain", &Type::domain)
            .def_property_readonly("spans", &Type::spans)
            // methods
            .def("derivatives_at", &Type::derivatives_at, "t"_a, "order"_a)
            .def("point_at", &Type::point_at, "t"_a)
        ;
    }